

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SpectrumPtexTexture *
pbrt::SpectrumPtexTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  SpectrumPtexTexture *pSVar1;
  ColorEncodingHandle encoding;
  string encodingString;
  string filename;
  allocator<char> local_92;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  polymorphic_allocator<std::byte> local_30;
  string local_28;
  
  local_30.memoryResource = alloc.memoryResource;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"filename",&local_91);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_92);
  TextureParameterDictionary::GetOneString(&local_50,parameters,&local_90,&local_70);
  ResolveFilename(&local_28,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"encoding",&local_91);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"gamma 2.2",&local_92);
  TextureParameterDictionary::GetOneString(&local_50,parameters,&local_90,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  ColorEncodingHandle::Get(&local_90);
  pSVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::SpectrumPtexTexture,std::__cxx11::string&,pbrt::ColorEncodingHandle&>
                     (&local_30,&local_28,(ColorEncodingHandle *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_28);
  return pSVar1;
}

Assistant:

SpectrumPtexTexture *SpectrumPtexTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
    std::string encodingString = parameters.GetOneString("encoding", "gamma 2.2");
    ColorEncodingHandle encoding = ColorEncodingHandle::Get(encodingString);
    return alloc.new_object<SpectrumPtexTexture>(filename, encoding);
}